

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

void printNgrams(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *args)

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  reference os;
  ostream *poVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fasttext::Vector>
  *ngramVector;
  iterator __end1;
  iterator __begin1;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fasttext::Vector>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fasttext::Vector>_>_>
  *__range1;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fasttext::Vector>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fasttext::Vector>_>_>
  ngramVectors;
  string word;
  FastText fasttext;
  string *in_stack_00000158;
  FastText *in_stack_00000160;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fasttext::Vector>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fasttext::Vector>_>_>
  *in_stack_fffffffffffffec8;
  ostream *in_stack_fffffffffffffed0;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fasttext::Vector>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fasttext::Vector>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fasttext::Vector>_>_>_>
  in_stack_ffffffffffffff00;
  string local_d8 [48];
  string local_a8 [8];
  string *in_stack_ffffffffffffff60;
  FastText *in_stack_ffffffffffffff68;
  
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(in_RDI);
  if (sVar2 != 4) {
    printPrintNgramsUsage();
    exit(1);
  }
  ::fasttext::FastText::FastText((FastText *)in_stack_ffffffffffffff00._M_current);
  pvVar3 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](in_RDI,2);
  std::__cxx11::string::string(local_a8,(string *)pvVar3);
  ::fasttext::FastText::loadModel(in_stack_00000160,in_stack_00000158);
  std::__cxx11::string::~string(local_a8);
  pvVar3 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](in_RDI,3);
  std::__cxx11::string::string(local_d8,(string *)pvVar3);
  ::fasttext::FastText::getNgramVectors(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fasttext::Vector>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fasttext::Vector>_>_>
  ::begin(in_stack_fffffffffffffec8);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fasttext::Vector>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fasttext::Vector>_>_>
  ::end(in_stack_fffffffffffffec8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fasttext::Vector>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fasttext::Vector>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fasttext::Vector>_>_>_>
                        *)in_stack_fffffffffffffed0,
                       (__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fasttext::Vector>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fasttext::Vector>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fasttext::Vector>_>_>_>
                        *)in_stack_fffffffffffffec8);
    if (!bVar1) break;
    os = __gnu_cxx::
         __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fasttext::Vector>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fasttext::Vector>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fasttext::Vector>_>_>_>
         ::operator*((__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fasttext::Vector>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fasttext::Vector>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fasttext::Vector>_>_>_>
                      *)&stack0xffffffffffffff00);
    poVar4 = std::operator<<((ostream *)&std::cout,(string *)os);
    std::operator<<(poVar4," ");
    in_stack_fffffffffffffed0 = ::fasttext::operator<<((ostream *)os,(Vector *)in_RDI);
    std::ostream::operator<<(in_stack_fffffffffffffed0,std::endl<char,std::char_traits<char>>);
    __gnu_cxx::
    __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fasttext::Vector>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fasttext::Vector>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fasttext::Vector>_>_>_>
    ::operator++((__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fasttext::Vector>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fasttext::Vector>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fasttext::Vector>_>_>_>
                  *)&stack0xffffffffffffff00);
  }
  exit(0);
}

Assistant:

void printNgrams(const std::vector<std::string> args) {
  if (args.size() != 4) {
    printPrintNgramsUsage();
    exit(EXIT_FAILURE);
  }
  FastText fasttext;
  fasttext.loadModel(std::string(args[2]));

  std::string word(args[3]);
  std::vector<std::pair<std::string, Vector>> ngramVectors =
      fasttext.getNgramVectors(word);

  for (const auto& ngramVector : ngramVectors) {
    std::cout << ngramVector.first << " " << ngramVector.second << std::endl;
  }

  exit(0);
}